

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray
          (GeneratedCodeInfo_Annotation *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint *puVar1;
  int32 iVar2;
  void *pvVar3;
  bool bVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  byte *local_40;
  byte *local_38;
  
  uVar8 = (this->_path_cached_byte_size_).super___atomic_base<int>._M_i;
  pbVar5 = target;
  if (0 < (int)uVar8) {
    local_40 = target;
    local_38 = target;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    *local_38 = 10;
    local_38 = local_38 + 2;
    for (; 0x7f < uVar8; uVar8 = uVar8 >> 7) {
      local_38[-1] = (byte)uVar8 | 0x80;
      local_38 = local_38 + 1;
    }
    local_38[-1] = (byte)uVar8;
    puVar9 = (uint *)(this->path_).arena_or_elements_;
    puVar1 = puVar9 + (this->path_).current_size_;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
      uVar8 = *puVar9;
      if ((ulong)(long)(int)uVar8 < 0x80) {
        *local_38 = (byte)uVar8;
        local_38 = local_38 + 1;
      }
      else {
        *local_38 = (byte)uVar8 | 0x80;
        uVar6 = (ulong)(long)(int)uVar8 >> 7;
        if (uVar8 < 0x4000) {
          local_38[1] = (byte)uVar6;
          local_38 = local_38 + 2;
        }
        else {
          local_38 = local_38 + 2;
          do {
            pbVar5 = local_38;
            pbVar5[-1] = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_38 = pbVar5 + 1;
            bVar4 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar4);
          *pbVar5 = (byte)uVar7;
        }
      }
      puVar9 = puVar9 + 1;
      pbVar5 = local_38;
    } while (puVar9 < puVar1);
  }
  local_40 = pbVar5;
  uVar8 = (this->_has_bits_).has_bits_[0];
  if ((uVar8 & 1) != 0) {
    local_40 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,2,(this->source_file_).ptr_,local_40);
  }
  if ((uVar8 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    iVar2 = this->begin_;
    *local_40 = 0x18;
    local_40 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar2,local_40 + 1);
  }
  if ((uVar8 & 4) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    iVar2 = this->end_;
    *local_40 = 0x20;
    local_40 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar2,local_40 + 1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    local_40 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),local_40,stream);
  }
  return local_40;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = _path_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, _internal_path(), byte_size, target);
    }
  }

  cached_has_bits = _has_bits_[0];
  // optional string source_file = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_source_file().data(), static_cast<int>(this->_internal_source_file().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_source_file(), target);
  }

  // optional int32 begin = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_begin(), target);
  }

  // optional int32 end = 4;
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}